

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pageFreeArray(MemPage *pPg,int iFirst,int nCell,CellArray *pCArray)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  u8 *puVar4;
  u8 *puVar5;
  uint uVar6;
  int sz;
  u8 *pCell;
  u8 *puStack_58;
  int szFree;
  u8 *pFree;
  int local_48;
  int iEnd;
  int i;
  int nRet;
  u8 *pStart;
  u8 *pEnd;
  u8 *aData;
  CellArray *pCArray_local;
  int nCell_local;
  int iFirst_local;
  MemPage *pPg_local;
  
  puVar4 = pPg->aData;
  uVar3 = pPg->pBt->usableSize;
  bVar1 = pPg->hdrOffset;
  bVar2 = pPg->childPtrSize;
  iEnd = 0;
  puStack_58 = (u8 *)0x0;
  pCell._4_4_ = 0;
  local_48 = iFirst;
  do {
    if (iFirst + nCell <= local_48) {
      if (puStack_58 != (u8 *)0x0) {
        freeSpace(pPg,(short)puStack_58 - (short)puVar4,(u16)pCell._4_4_);
      }
      return iEnd;
    }
    puVar5 = pCArray->apCell[local_48];
    if ((puVar4 + (int)(bVar1 + 8 + (uint)bVar2) <= puVar5) && (puVar5 < puVar4 + uVar3)) {
      uVar6 = (uint)pCArray->szCell[local_48];
      if (puStack_58 == puVar5 + (int)uVar6) {
        pCell._4_4_ = uVar6 + pCell._4_4_;
      }
      else {
        if (puStack_58 != (u8 *)0x0) {
          freeSpace(pPg,(short)puStack_58 - (short)puVar4,(u16)pCell._4_4_);
        }
        pCell._4_4_ = uVar6;
        if (puVar4 + uVar3 < puVar5 + (int)uVar6) {
          return 0;
        }
      }
      iEnd = iEnd + 1;
      puStack_58 = puVar5;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

static int pageFreeArray(
  MemPage *pPg,                   /* Page to edit */
  int iFirst,                     /* First cell to delete */
  int nCell,                      /* Cells to delete */
  CellArray *pCArray              /* Array of cells */
){
  u8 * const aData = pPg->aData;
  u8 * const pEnd = &aData[pPg->pBt->usableSize];
  u8 * const pStart = &aData[pPg->hdrOffset + 8 + pPg->childPtrSize];
  int nRet = 0;
  int i;
  int iEnd = iFirst + nCell;
  u8 *pFree = 0;
  int szFree = 0;

  for(i=iFirst; i<iEnd; i++){
    u8 *pCell = pCArray->apCell[i];
    if( SQLITE_WITHIN(pCell, pStart, pEnd) ){
      int sz;
      /* No need to use cachedCellSize() here.  The sizes of all cells that
      ** are to be freed have already been computing while deciding which
      ** cells need freeing */
      sz = pCArray->szCell[i];  assert( sz>0 );
      if( pFree!=(pCell + sz) ){
        if( pFree ){
          assert( pFree>aData && (pFree - aData)<65536 );
          freeSpace(pPg, (u16)(pFree - aData), szFree);
        }
        pFree = pCell;
        szFree = sz;
        if( pFree+sz>pEnd ) return 0;
      }else{
        pFree = pCell;
        szFree += sz;
      }
      nRet++;
    }
  }
  if( pFree ){
    assert( pFree>aData && (pFree - aData)<65536 );
    freeSpace(pPg, (u16)(pFree - aData), szFree);
  }
  return nRet;
}